

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileParser::getHomogeneousVector3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  char *this_00;
  pointer *ppaVar1;
  iterator __position;
  byte *pbVar2;
  byte *pbVar3;
  float fVar4;
  float fVar5;
  byte *pbVar6;
  runtime_error *this_01;
  undefined1 in_CL;
  float fVar7;
  ai_real ret;
  aiVector3t<float> local_48;
  undefined1 local_38 [16];
  
  this_00 = this->m_buffer;
  copyNextWord(this,this_00,0x1000);
  local_48.x = 0.0;
  fast_atoreal_move<float>((Assimp *)this_00,(char *)&local_48,(float *)0x1,(bool)in_CL);
  fVar7 = local_48.x;
  copyNextWord(this,this_00,0x1000);
  local_48.x = 0.0;
  fast_atoreal_move<float>((Assimp *)this_00,(char *)&local_48,(float *)0x1,(bool)in_CL);
  fVar4 = local_48.x;
  copyNextWord(this,this_00,0x1000);
  local_48.x = 0.0;
  fast_atoreal_move<float>((Assimp *)this_00,(char *)&local_48,(float *)0x1,(bool)in_CL);
  fVar5 = local_48.x;
  copyNextWord(this,this_00,0x1000);
  local_48._0_8_ = (ulong)(uint)local_48.y << 0x20;
  fast_atoreal_move<float>((Assimp *)this_00,(char *)&local_48,(float *)0x1,(bool)in_CL);
  if ((local_48.x == 0.0) && (!NAN(local_48.x))) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48._0_8_ = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"OBJ: Invalid component in homogeneous vector (Division by zero)"
               ,"");
    std::runtime_error::runtime_error(this_01,(string *)&local_48);
    *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  fVar7 = fVar7 / local_48.x;
  local_48.y = fVar4 / local_48.x;
  local_48.z = fVar5 / local_48.x;
  local_48.x = fVar7;
  __position._M_current =
       (point3d_array->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (point3d_array->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array,
               __position,&local_48);
  }
  else {
    (__position._M_current)->z = local_48.z;
    (__position._M_current)->x = fVar7;
    (__position._M_current)->y = local_48.y;
    ppaVar1 = &(point3d_array->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  pbVar6 = (byte *)(this->m_DataIt)._M_current;
  pbVar2 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar2 + -1 != pbVar6 && pbVar6 != pbVar2) {
    do {
      if (((*pbVar6 < 0xe) && ((0x3401U >> (*pbVar6 & 0x1f) & 1) != 0)) ||
         (pbVar6 = pbVar6 + 1, pbVar6 == pbVar2)) break;
    } while (pbVar6 != pbVar2 + -1);
  }
  pbVar3 = pbVar6;
  if (pbVar6 != pbVar2) {
    pbVar6 = pbVar6 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar3 = pbVar6;
  }
  for (; (pbVar3 != pbVar2 && ((*pbVar3 == 0x20 || (pbVar6 = pbVar3, *pbVar3 == 9))));
      pbVar3 = pbVar3 + 1) {
    pbVar6 = pbVar2;
  }
  (this->m_DataIt)._M_current = (char *)pbVar6;
  return;
}

Assistant:

void ObjFileParser::getHomogeneousVector3( std::vector<aiVector3D> &point3d_array ) {
    ai_real x, y, z, w;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    copyNextWord( m_buffer, Buffersize );
    w = ( ai_real ) fast_atof( m_buffer );

    if (w == 0)
      throw DeadlyImportError("OBJ: Invalid component in homogeneous vector (Division by zero)");

    point3d_array.push_back( aiVector3D( x/w, y/w, z/w ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}